

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O1

bool __thiscall indk::Neuron::doSignalSendEntry(Neuron *this,string *From,float X,int64_t tn)

{
  pointer ppVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  bool bVar3;
  int iVar4;
  Computer *pCVar5;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
  *__range1;
  pointer ppVar6;
  bool bVar7;
  
  ppVar6 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar6 != ppVar1) {
    __s2 = (From->_M_dataplus)._M_p;
    sVar2 = From->_M_string_length;
    do {
      __n = (ppVar6->first)._M_string_length;
      if ((__n == sVar2) &&
         ((__n == 0 || (iVar4 = bcmp((ppVar6->first)._M_dataplus._M_p,__s2,__n), iVar4 == 0)))) {
        Entry::doIn(ppVar6->second,X,tn);
        break;
      }
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != ppVar1);
  }
  ppVar6 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = ppVar6 == ppVar1;
  if (!bVar7) {
    bVar3 = Entry::doCheckState(ppVar6->second,tn);
    if (bVar3) {
      do {
        bVar7 = ppVar6 + 1 == ppVar1;
        if (bVar7) goto LAB_0015b27b;
        bVar3 = Entry::doCheckState(ppVar6[1].second,tn);
        ppVar6 = ppVar6 + 1;
      } while (bVar3);
    }
    if (bVar7 == false) {
      return false;
    }
  }
LAB_0015b27b:
  pCVar5 = System::getComputeBackend();
  (*pCVar5->_vptr_Computer[3])(pCVar5,this);
  return bVar7;
}

Assistant:

bool indk::Neuron::doSignalSendEntry(const std::string& From, float X, int64_t tn) {
    for (const auto &e: Entries) {
        if (e.first == From) {
            e.second -> doIn(X, tn);
            break;
        }
    }

    for (auto &e: Entries) {
        if (!e.second->doCheckState(tn)) {
//            std::cout << "In to entry of " << Name << " from " << From << " value " << X << " (" << tn << ") - not ready" << std::endl;
            return false;
        }
    }
//    std::cout << "In to entry of " << Name << " from " << From << " value " << X <<  " (" << tn << ") - ready" << std::endl;
    indk::System::getComputeBackend() -> doProcess((void*)this);
    return true;
}